

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::generateFullDeclaration
               (ostringstream *src,StructType *structType,int indentLevel)

{
  bool bVar1;
  int indentLevel_00;
  deUint32 dVar2;
  ostream *poVar3;
  pointer pSVar4;
  VarType *type;
  string *psVar5;
  Indent local_44;
  StructMember *local_40;
  Indent local_34;
  __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
  local_30;
  __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
  local_28;
  ConstIterator memberIter;
  int indentLevel_local;
  StructType *structType_local;
  ostringstream *src_local;
  
  memberIter._M_current._4_4_ = indentLevel;
  std::operator<<((ostream *)src,"struct");
  bVar1 = StructType::hasTypeName(structType);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)src," ");
    psVar5 = StructType::getTypeName_abi_cxx11_(structType);
    std::operator<<(poVar3,(string *)psVar5);
  }
  poVar3 = std::operator<<((ostream *)src,"\n");
  Indent::Indent((Indent *)&memberIter,memberIter._M_current._4_4_);
  poVar3 = operator<<(poVar3,(Indent *)&memberIter);
  std::operator<<(poVar3,"{\n");
  local_28._M_current = (StructMember *)StructType::begin(structType);
  while( true ) {
    local_30._M_current = (StructMember *)StructType::end(structType);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    Indent::Indent(&local_34,memberIter._M_current._4_4_ + 1);
    operator<<((ostream *)src,&local_34);
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
             ::operator->(&local_28);
    type = StructMember::getType(pSVar4);
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
             ::operator->(&local_28);
    psVar5 = StructMember::getName_abi_cxx11_(pSVar4);
    indentLevel_00 = memberIter._M_current._4_4_ + 1;
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
             ::operator->(&local_28);
    dVar2 = StructMember::getFlags(pSVar4);
    generateDeclaration(src,type,psVar5,indentLevel_00,dVar2 & 0x1800,0xfffffeff,0);
    local_40 = (StructMember *)
               __gnu_cxx::
               __normal_iterator<const_vkt::ubo::StructMember_*,_std::vector<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>_>
               ::operator++(&local_28,0);
  }
  Indent::Indent(&local_44,memberIter._M_current._4_4_);
  poVar3 = operator<<((ostream *)src,&local_44);
  std::operator<<(poVar3,"}");
  return;
}

Assistant:

void generateFullDeclaration (std::ostringstream& src, const StructType& structType, int indentLevel)
{
	src << "struct";
	if (structType.hasTypeName())
		src << " " << structType.getTypeName();
	src << "\n" << Indent(indentLevel) << "{\n";

	for (StructType::ConstIterator memberIter = structType.begin(); memberIter != structType.end(); memberIter++)
	{
		src << Indent(indentLevel + 1);
		generateDeclaration(src, memberIter->getType(), memberIter->getName(), indentLevel + 1, memberIter->getFlags() & UNUSED_BOTH, ~LAYOUT_OFFSET, 0u);
	}

	src << Indent(indentLevel) << "}";
}